

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

path_node_type * __thiscall
jsoncons::jsonpath::detail::
eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
::create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
          (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,basic_path_node<char> **args,unsigned_long *args_1)

{
  pointer this_00;
  path_node_type *ptr;
  __single_object temp;
  value_type *in_stack_ffffffffffffffa8;
  vector<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  unsigned_long *in_stack_ffffffffffffffd0;
  basic_path_node<char> **in_stack_ffffffffffffffd8;
  
  std::
  make_unique<jsoncons::jsonpath::basic_path_node<char>,jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  this_00 = std::
            unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
            ::get((unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
                   *)in_stack_ffffffffffffffb0);
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>_>_>
  ::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::
  unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
  ::~unique_ptr((unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
                 *)this_00);
  return this_00;
}

Assistant:

const path_node_type* create_path_node(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<path_node_type>(std::forward<Args>(args)...);
            path_node_type* ptr = temp.get();
            temp_node_values_.push_back(std::move(temp));
            return ptr;
        }